

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

bool Eigen::internal::
     any_unroller<Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_1,_3,_1,_1,_3>_>_>_>,_3>
     ::run(evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_1,_3,_1,_1,_3>_>_>_>
           *mat)

{
  double dVar1;
  double *pdVar2;
  bool bVar3;
  
  pdVar2 = (mat->
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           ).m_lhsImpl.
           super_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>.
           super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::IndexBased,_double>
           .
           super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           .m_argImpl.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>.m_data;
  dVar1 = (mat->
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          ).m_rhsImpl.
          super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_1,_3,_1,_1,_3>_>_>
          .m_functor.m_other;
  bVar3 = true;
  if ((dVar1 < *pdVar2 || dVar1 == *pdVar2) && (dVar1 < pdVar2[1] || dVar1 == pdVar2[1])) {
    bVar3 = pdVar2[2] <= dVar1 && dVar1 != pdVar2[2];
  }
  return bVar3;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
  CoeffReturnType coeff(Index row, Index col) const
  {
    if (IsRowMajor)
      return m_data[row * m_outerStride.value() + col];
    else
      return m_data[row + col * m_outerStride.value()];
  }